

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ARMDisassembler.c
# Opt level: O1

void ITStatus_setITState(ARM_ITStatus *it,char Firstcond,char Mask)

{
  uint *puVar1;
  uint uVar2;
  byte bVar3;
  byte bVar4;
  uint uVar5;
  undefined3 in_register_00000011;
  uint uVar6;
  
  uVar6 = CONCAT31(in_register_00000011,Mask);
  if (uVar6 == 0) {
    uVar5 = 0x20;
  }
  else {
    uVar5 = 0;
    if (uVar6 != 0) {
      for (; (uVar6 >> uVar5 & 1) == 0; uVar5 = uVar5 + 1) {
      }
    }
  }
  bVar4 = Firstcond & 0xf;
  if (uVar5 < 3) {
    puVar1 = &it->size;
    uVar5 = uVar5 + 1;
    do {
      if (((uVar6 >> (uVar5 & 0x1f) & 1) != 0) == (bool)(Firstcond & 1U)) {
        uVar2 = *puVar1;
        bVar3 = bVar4;
      }
      else {
        uVar2 = *puVar1;
        bVar3 = bVar4 ^ 1;
      }
      if (7 < uVar2) {
        *puVar1 = 0;
      }
      it->ITStates[it->size] = bVar3;
      it->size = it->size + 1;
      uVar5 = uVar5 + 1;
    } while (uVar5 != 4);
  }
  if (7 < it->size) {
    it->size = 0;
  }
  it->ITStates[it->size] = bVar4;
  it->size = it->size + 1;
  return;
}

Assistant:

static void ITStatus_setITState(ARM_ITStatus *it, char Firstcond, char Mask)
{
	// (3 - the number of trailing zeros) is the number of then / else.
	unsigned CondBit0 = Firstcond & 1;
	unsigned NumTZ = CountTrailingZeros_32(Mask);
	unsigned char CCBits = (unsigned char)Firstcond & 0xf;
	unsigned Pos;
	//assert(NumTZ <= 3 && "Invalid IT mask!");
	// push condition codes onto the stack the correct order for the pops
	for (Pos = NumTZ+1; Pos <= 3; ++Pos) {
		bool T = ((Mask >> Pos) & 1) == (int)CondBit0;
		if (T)
			ITStatus_push_back(it, CCBits);
		else
			ITStatus_push_back(it, CCBits ^ 1);
	}
	ITStatus_push_back(it, CCBits);
}